

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O0

int do_esc_char(uint32_t c,unsigned_long flags,char *do_quotes,BIO *out,int is_first,int is_last)

{
  int iVar1;
  size_t sVar2;
  int local_54;
  uchar local_49;
  int len;
  uchar u8;
  char buf [16];
  int is_last_local;
  int is_first_local;
  BIO *out_local;
  char *do_quotes_local;
  unsigned_long flags_local;
  uint32_t c_local;
  
  local_49 = (uchar)c;
  if (c < 0x10000) {
    if (c < 0x100) {
      if (((flags & 4) == 0) || (c < 0x80)) {
        if (((flags & 2) == 0) || (iVar1 = is_control_character(local_49), iVar1 == 0)) {
          if ((flags & 1) == 0) {
            if (((flags & 0xf) == 0) || (c != 0x5c)) {
              iVar1 = maybe_write(out,&local_49,1);
              if (iVar1 == 0) {
                return -1;
              }
              return 1;
            }
            snprintf((char *)&len,0x10,"\\%c",0x5c);
          }
          else if ((c == 0x5c) || (c == 0x22)) {
            snprintf((char *)&len,0x10,"\\%c",(ulong)c);
          }
          else {
            if ((((((c != 0x2c) && (c != 0x2b)) && (c != 0x3c)) && ((c != 0x3e && (c != 0x3b)))) &&
                ((is_first == 0 || ((c != 0x20 && (c != 0x23)))))) &&
               ((is_last == 0 || (c != 0x20)))) {
              iVar1 = maybe_write(out,&local_49,1);
              if (iVar1 == 0) {
                return -1;
              }
              return 1;
            }
            if ((flags & 8) != 0) {
              if (do_quotes != (char *)0x0) {
                *do_quotes = '\x01';
              }
              iVar1 = maybe_write(out,&local_49,1);
              if (iVar1 == 0) {
                return -1;
              }
              return 1;
            }
            snprintf((char *)&len,0x10,"\\%c",(ulong)c);
          }
        }
        else {
          snprintf((char *)&len,0x10,"\\%02X",(ulong)c);
        }
      }
      else {
        snprintf((char *)&len,0x10,"\\%02X",(ulong)c);
      }
    }
    else {
      snprintf((char *)&len,0x10,"\\U%04X",(ulong)c);
    }
  }
  else {
    snprintf((char *)&len,0x10,"\\W%08X",(ulong)c);
  }
  sVar2 = strlen((char *)&len);
  local_54 = (int)sVar2;
  iVar1 = maybe_write(out,&len,local_54);
  if (iVar1 == 0) {
    local_54 = -1;
  }
  return local_54;
}

Assistant:

static int do_esc_char(uint32_t c, unsigned long flags, char *do_quotes,
                       BIO *out, int is_first, int is_last) {
  // |c| is a |uint32_t| because, depending on |ASN1_STRFLGS_UTF8_CONVERT|,
  // we may be escaping bytes or Unicode codepoints.
  char buf[16];  // Large enough for "\\W01234567".
  unsigned char u8 = (unsigned char)c;
  if (c > 0xffff) {
    snprintf(buf, sizeof(buf), "\\W%08" PRIX32, c);
  } else if (c > 0xff) {
    snprintf(buf, sizeof(buf), "\\U%04" PRIX32, c);
  } else if ((flags & ASN1_STRFLGS_ESC_MSB) && c > 0x7f) {
    snprintf(buf, sizeof(buf), "\\%02X", c);
  } else if ((flags & ASN1_STRFLGS_ESC_CTRL) && is_control_character(c)) {
    snprintf(buf, sizeof(buf), "\\%02X", c);
  } else if (flags & ASN1_STRFLGS_ESC_2253) {
    // See RFC 2253, sections 2.4 and 4.
    if (c == '\\' || c == '"') {
      // Quotes and backslashes are always escaped, quoted or not.
      snprintf(buf, sizeof(buf), "\\%c", (int)c);
    } else if (c == ',' || c == '+' || c == '<' || c == '>' || c == ';' ||
               (is_first && (c == ' ' || c == '#')) ||
               (is_last && (c == ' '))) {
      if (flags & ASN1_STRFLGS_ESC_QUOTE) {
        // No need to escape, just tell the caller to quote.
        if (do_quotes != NULL) {
          *do_quotes = 1;
        }
        return maybe_write(out, &u8, 1) ? 1 : -1;
      }
      snprintf(buf, sizeof(buf), "\\%c", (int)c);
    } else {
      return maybe_write(out, &u8, 1) ? 1 : -1;
    }
  } else if ((flags & ESC_FLAGS) && c == '\\') {
    // If any escape flags are set, also escape backslashes.
    snprintf(buf, sizeof(buf), "\\%c", (int)c);
  } else {
    return maybe_write(out, &u8, 1) ? 1 : -1;
  }

  static_assert(sizeof(buf) < INT_MAX, "len may not fit in int");
  int len = (int)strlen(buf);
  return maybe_write(out, buf, len) ? len : -1;
}